

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5UnicodeCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  byte *z;
  char cVar1;
  int iVar2;
  Unicode61Tokenizer *p;
  char *pcVar3;
  long lVar4;
  u16 *puVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  
  if ((nArg & 1U) != 0) {
    return 1;
  }
  iVar2 = sqlite3_initialize();
  uVar6 = 7;
  if ((iVar2 == 0) &&
     (p = (Unicode61Tokenizer *)sqlite3Malloc(0xc0), p != (Unicode61Tokenizer *)0x0)) {
    memset(p,0,0xc0);
    p->nFold = 0x40;
    p->eRemoveDiacritic = 1;
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      pcVar3 = (char *)sqlite3Malloc(0x40);
      p->aFold = pcVar3;
      pcVar8 = "L* N* Co";
      if (0 < nArg && pcVar3 != (char *)0x0) {
        lVar4 = 0;
        do {
          if ((azArg[lVar4] != (char *)0x0) &&
             (iVar2 = sqlite3StrICmp(azArg[lVar4],"categories"), iVar2 == 0)) {
            pcVar8 = azArg[lVar4 + 1];
          }
          lVar4 = lVar4 + 2;
        } while ((int)lVar4 < nArg);
      }
      if (pcVar3 != (char *)0x0) {
        cVar1 = *pcVar8;
        if (cVar1 != '\0') {
LAB_001c5669:
          do {
            if (cVar1 != '\0') {
              if ((cVar1 == ' ') || (cVar1 == '\t')) {
                cVar1 = pcVar8[1];
                pcVar8 = pcVar8 + 1;
                goto LAB_001c5669;
              }
              iVar2 = sqlite3Fts5UnicodeCatParse(pcVar8,p->aCategory);
              if (iVar2 != 0) {
                uVar6 = 1;
                goto LAB_001c558e;
              }
            }
            while( true ) {
              cVar1 = *pcVar8;
              if (cVar1 == '\0') goto LAB_001c56ae;
              if ((cVar1 == '\t') || (cVar1 == ' ')) break;
              pcVar8 = pcVar8 + 1;
            }
          } while( true );
        }
LAB_001c56ae:
        uVar6 = 0;
        puVar5 = aFts5UnicodeData;
        do {
          uVar7 = (*puVar5 >> 5) + uVar6;
          if (0x7f < (int)uVar7) {
            uVar7 = 0x80;
          }
          if ((int)uVar6 < (int)uVar7) {
            memset(p->aTokenChar + (int)uVar6,(uint)p->aCategory[*puVar5 & 0x1f],
                   (ulong)(~uVar6 + uVar7) + 1);
            uVar6 = uVar7;
          }
          puVar5 = puVar5 + 1;
        } while ((int)uVar6 < 0x80);
        if (nArg < 1) {
          uVar6 = 0;
          goto LAB_001c5599;
        }
        lVar4 = 1;
        uVar7 = 1;
        do {
          pcVar8 = azArg[lVar4 + -1];
          uVar6 = uVar7;
          if (pcVar8 == (char *)0x0) goto LAB_001c558e;
          z = (byte *)azArg[lVar4];
          iVar2 = sqlite3StrICmp(pcVar8,"remove_diacritics");
          if (iVar2 == 0) {
            if ((2 < (byte)(*z - 0x30)) || (z[1] != 0)) goto LAB_001c558e;
            p->eRemoveDiacritic = *z - 0x30;
            uVar6 = 0;
          }
          else {
            iVar2 = sqlite3StrICmp(pcVar8,"tokenchars");
            if (iVar2 == 0) {
              uVar6 = fts5UnicodeAddExceptions(p,(char *)z,1);
            }
            else {
              iVar2 = sqlite3StrICmp(pcVar8,"separators");
              if (iVar2 == 0) {
                uVar6 = fts5UnicodeAddExceptions(p,(char *)z,0);
              }
              else {
                iVar2 = sqlite3StrICmp(pcVar8,"categories");
                uVar6 = (uint)(iVar2 != 0);
              }
            }
          }
        } while ((uVar6 == 0) && (iVar2 = (int)lVar4, lVar4 = lVar4 + 2, iVar2 + 1 < nArg));
        if (uVar6 == 0) {
          uVar6 = 0;
          goto LAB_001c5599;
        }
      }
    }
    else {
      p->aFold = (char *)0x0;
    }
  }
  else {
    p = (Unicode61Tokenizer *)0x0;
  }
LAB_001c558e:
  fts5UnicodeDelete((Fts5Tokenizer *)p);
  p = (Unicode61Tokenizer *)0x0;
LAB_001c5599:
  *ppOut = (Fts5Tokenizer *)p;
  return uVar6;
}

Assistant:

static int fts5UnicodeCreate(
  void *pUnused, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;             /* Return code */
  Unicode61Tokenizer *p = 0;      /* New tokenizer object */ 

  UNUSED_PARAM(pUnused);

  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = (Unicode61Tokenizer*)sqlite3_malloc(sizeof(Unicode61Tokenizer));
    if( p ){
      const char *zCat = "L* N* Co";
      int i;
      memset(p, 0, sizeof(Unicode61Tokenizer));

      p->eRemoveDiacritic = FTS5_REMOVE_DIACRITICS_SIMPLE;
      p->nFold = 64;
      p->aFold = sqlite3_malloc64(p->nFold * sizeof(char));
      if( p->aFold==0 ){
        rc = SQLITE_NOMEM;
      }

      /* Search for a "categories" argument */
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          zCat = azArg[i+1];
        }
      }

      if( rc==SQLITE_OK ){
        rc = unicodeSetCategories(p, zCat);
      }

      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "remove_diacritics") ){
          if( (zArg[0]!='0' && zArg[0]!='1' && zArg[0]!='2') || zArg[1] ){
            rc = SQLITE_ERROR;
          }else{
            p->eRemoveDiacritic = (zArg[0] - '0');
            assert( p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_NONE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_SIMPLE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_COMPLEX
            );
          }
        }else
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 0);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          /* no-op */
        }else{
          rc = SQLITE_ERROR;
        }
      }

    }else{
      rc = SQLITE_NOMEM;
    }
    if( rc!=SQLITE_OK ){
      fts5UnicodeDelete((Fts5Tokenizer*)p);
      p = 0;
    }
    *ppOut = (Fts5Tokenizer*)p;
  }
  return rc;
}